

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

int miniros::set_non_blocking(socket_fd_t *socket)

{
  int iVar1;
  int *piVar2;
  int *in_RDI;
  undefined4 local_4;
  
  iVar1 = fcntl(*in_RDI,4,0x800);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    local_4 = *piVar2;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int set_non_blocking(socket_fd_t& socket)
{
#ifdef WIN32
  u_long non_blocking = 1;
  if (ioctlsocket(socket, FIONBIO, &non_blocking) != 0) {
    return WSAGetLastError();
  }
#else
  if (fcntl(socket, F_SETFL, O_NONBLOCK) == -1) {
    return errno;
  }
#endif
  return 0;
}